

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

bool __thiscall
YacclabTests::CheckFileList
          (YacclabTests *this,path *base_path,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  ulong uVar4;
  long lVar5;
  error_code ec;
  path local_70;
  string local_50 [32];
  
  ppVar3 = (filenames->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar2 = true;
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(filenames->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) / 0x28);
      uVar4 = uVar4 + 1) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    filesystem::path::path(&local_70,(string *)((long)&(ppVar3->first)._M_dataplus._M_p + lVar5));
    filesystem::operator/((path *)local_50,base_path,&local_70);
    bVar1 = filesystem::exists((path *)local_50,&ec);
    (&((filenames->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       )._M_impl.super__Vector_impl_data._M_start)->second)[lVar5] = bVar1;
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    ppVar3 = (filenames->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar2 = (bool)(bVar2 & (&ppVar3->second)[lVar5]);
    lVar5 = lVar5 + 0x28;
  }
  return bVar2;
}

Assistant:

bool YacclabTests::CheckFileList(const path& base_path, std::vector<std::pair<std::string, bool>>& filenames)
{
    bool ret = true;
    for (size_t i = 0; i < filenames.size(); ++i) {
        std::error_code ec;
        filenames[i].second = filesystem::exists(base_path / path(filenames[i].first), ec);
        if (!filenames[i].second) {
            ret = false;
        }
    }
    return ret;
}